

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

bool doctest::anon_unknown_15::parseCommaSepArgs
               (int argc,char **argv,char *pattern,
               vector<doctest::String,_std::allocator<doctest::String>_> *res)

{
  char cVar1;
  bool bVar2;
  char *__s;
  size_t sVar3;
  char *pcVar4;
  char character;
  char *end;
  char *current;
  undefined1 auStack_1f0 [7];
  bool seenBackslash;
  anon_class_16_2_fa5d9a36 flush;
  ostringstream s;
  String local_58;
  undefined1 local_40 [8];
  String filtersString;
  vector<doctest::String,_std::allocator<doctest::String>_> *res_local;
  char *pattern_local;
  char **argv_local;
  int argc_local;
  
  filtersString.field_0._16_8_ = res;
  String::String((String *)local_40);
  String::String(&local_58);
  bVar2 = parseOption(argc,argv,pattern,(String *)local_40,&local_58);
  String::~String(&local_58);
  if (bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&flush.res);
    _auStack_1f0 = (ostringstream *)&flush.res;
    flush.s = (ostringstream *)filtersString.field_0._16_8_;
    bVar2 = false;
    __s = String::c_str((String *)local_40);
    sVar3 = strlen(__s);
    end = __s;
    while (end != __s + sVar3) {
      pcVar4 = end + 1;
      cVar1 = *end;
      end = pcVar4;
      if (bVar2) {
        bVar2 = false;
        if ((cVar1 != ',') && (cVar1 != '\\')) {
          std::ostream::put((char)&flush + '\b');
          goto LAB_0011761d;
        }
        std::ostream::put((char)&flush + '\b');
      }
      else {
LAB_0011761d:
        if (cVar1 == '\\') {
          bVar2 = true;
        }
        else if (cVar1 == ',') {
          parseCommaSepArgs::anon_class_16_2_fa5d9a36::operator()
                    ((anon_class_16_2_fa5d9a36 *)auStack_1f0);
        }
        else {
          std::ostream::put((char)&flush + '\b');
        }
      }
    }
    if (bVar2) {
      std::ostream::put((char)&flush + '\b');
    }
    parseCommaSepArgs::anon_class_16_2_fa5d9a36::operator()((anon_class_16_2_fa5d9a36 *)auStack_1f0)
    ;
    argv_local._7_1_ = true;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&flush.res);
  }
  else {
    argv_local._7_1_ = false;
  }
  String::~String((String *)local_40);
  return argv_local._7_1_;
}

Assistant:

bool parseCommaSepArgs(int argc, const char* const* argv, const char* pattern,
                           std::vector<String>& res) {
        String filtersString;
        if(parseOption(argc, argv, pattern, &filtersString)) {
            // tokenize with "," as a separator, unless escaped with backslash
            std::ostringstream s;
            auto flush = [&s, &res]() {
                auto string = s.str();
                if(string.size() > 0) {
                    res.push_back(string.c_str());
                }
                s.str("");
            };

            bool seenBackslash = false;
            const char* current = filtersString.c_str();
            const char* end = current + strlen(current);
            while(current != end) {
                char character = *current++;
                if(seenBackslash) {
                    seenBackslash = false;
                    if(character == ',' || character == '\\') {
                        s.put(character);
                        continue;
                    }
                    s.put('\\');
                }
                if(character == '\\') {
                    seenBackslash = true;
                } else if(character == ',') {
                    flush();
                } else {
                    s.put(character);
                }
            }

            if(seenBackslash) {
                s.put('\\');
            }
            flush();
            return true;
        }
        return false;
    }